

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O2

void __thiscall Salsa20Cipher::setKey(Salsa20Cipher *this,uint8_t *key,size_t keySize)

{
  char *pcVar1;
  uint8_t *bytes;
  uint8_t paddedKey [32];
  uint8_t local_48 [32];
  
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  local_48[0x10] = '\0';
  local_48[0x11] = '\0';
  local_48[0x12] = '\0';
  local_48[0x13] = '\0';
  local_48[0x14] = '\0';
  local_48[0x15] = '\0';
  local_48[0x16] = '\0';
  local_48[0x17] = '\0';
  local_48[0x18] = '\0';
  local_48[0x19] = '\0';
  local_48[0x1a] = '\0';
  local_48[0x1b] = '\0';
  local_48[0x1c] = '\0';
  local_48[0x1d] = '\0';
  local_48[0x1e] = '\0';
  local_48[0x1f] = '\0';
  if (keySize != 0) {
    memcpy(local_48,key,keySize);
    if (0x10 < keySize) {
      bytesToUint((uint8_t *)"expand 32-byte k",(uint32_t *)this);
      bytesToUint(local_48,(this->m_state)._M_elems + 1);
      bytesToUint(local_48 + 4,(this->m_state)._M_elems + 2);
      bytesToUint(local_48 + 8,(this->m_state)._M_elems + 3);
      bytesToUint(local_48 + 0xc,(this->m_state)._M_elems + 4);
      bytesToUint("nd 32-byte k",(this->m_state)._M_elems + 5);
      bytesToUint("2-byte k",(this->m_state)._M_elems + 10);
      bytesToUint(local_48 + 0x10,(this->m_state)._M_elems + 0xb);
      bytesToUint(local_48 + 0x14,(this->m_state)._M_elems + 0xc);
      bytesToUint(local_48 + 0x18,(this->m_state)._M_elems + 0xd);
      pcVar1 = "expand 32-byte k";
      bytes = local_48 + 0x1c;
      goto LAB_00119e6f;
    }
  }
  bytesToUint((uint8_t *)"expand 16-byte k",(uint32_t *)this);
  bytesToUint(local_48,(this->m_state)._M_elems + 1);
  bytesToUint(local_48 + 4,(this->m_state)._M_elems + 2);
  bytesToUint(local_48 + 8,(this->m_state)._M_elems + 3);
  bytes = local_48 + 0xc;
  bytesToUint(bytes,(this->m_state)._M_elems + 4);
  bytesToUint("nd 16-byte k",(this->m_state)._M_elems + 5);
  bytesToUint("6-byte k",(this->m_state)._M_elems + 10);
  bytesToUint(local_48,(this->m_state)._M_elems + 0xb);
  bytesToUint(local_48 + 4,(this->m_state)._M_elems + 0xc);
  bytesToUint(local_48 + 8,(this->m_state)._M_elems + 0xd);
  pcVar1 = "expand 16-byte k";
LAB_00119e6f:
  bytesToUint(bytes,(this->m_state)._M_elems + 0xe);
  bytesToUint((uint8_t *)(pcVar1 + 0xc),(this->m_state)._M_elems + 0xf);
  return;
}

Assistant:

void setKey(const uint8_t key[KEY_MAX_SIZE], size_t keySize)
	{
		const auto sz = sizeof(uint32_t);
		
		uint8_t paddedKey[KEY_MAX_SIZE] = { 0 };
		std::copy(key, key + keySize, paddedKey);
		
		if (keySize > KEY_MAX_SIZE / 2) {
			static const auto magic = reinterpret_cast<const uint8_t*>("expand 32-byte k");
			
			bytesToUint(magic + 0 * sz, m_state[0]);
			bytesToUint(paddedKey + 0 * sz, m_state[1]);
			bytesToUint(paddedKey + 1 * sz, m_state[2]);
			bytesToUint(paddedKey + 2 * sz, m_state[3]);
			bytesToUint(paddedKey + 3 * sz, m_state[4]);
			bytesToUint(magic + 1 * sz, m_state[5]);
			bytesToUint(magic + 2 * sz, m_state[10]);
			bytesToUint(paddedKey + 4 * sz, m_state[11]);
			bytesToUint(paddedKey + 5 * sz, m_state[12]);
			bytesToUint(paddedKey + 6 * sz, m_state[13]);
			bytesToUint(paddedKey + 7 * sz, m_state[14]);
			bytesToUint(magic + 3 * sz, m_state[15]);
		} else {
			static const auto magic = reinterpret_cast<const uint8_t*>("expand 16-byte k");
			
			bytesToUint(magic + 0 * sz, m_state[0]);
			bytesToUint(paddedKey + 0 * sz, m_state[1]);
			bytesToUint(paddedKey + 1 * sz, m_state[2]);
			bytesToUint(paddedKey + 2 * sz, m_state[3]);
			bytesToUint(paddedKey + 3 * sz, m_state[4]);
			bytesToUint(magic + 1 * sz, m_state[5]);
			bytesToUint(magic + 2 * sz, m_state[10]);
			bytesToUint(paddedKey + 0 * sz, m_state[11]);
			bytesToUint(paddedKey + 1 * sz, m_state[12]);
			bytesToUint(paddedKey + 2 * sz, m_state[13]);
			bytesToUint(paddedKey + 3 * sz, m_state[14]);
			bytesToUint(magic + 3 * sz, m_state[15]);
		}
	}